

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int check_acl(mg_context *phys_ctx,usa *sa)

{
  byte bVar1;
  int iVar2;
  char *list;
  char *in_RCX;
  char *extraout_RDX;
  char *func;
  char *extraout_RDX_00;
  int iVar3;
  vec vec;
  
  list = (phys_ctx->dd).config[0x25];
  iVar3 = (uint)(list != (char *)0x0) * 2 + 0x2b;
  while( true ) {
    list = next_option(list,&vec,(vec *)0x0);
    if (list == (char *)0x0) {
      return (uint)(iVar3 == 0x2b);
    }
    func = extraout_RDX;
    if (vec.len == 0) break;
    bVar1 = *vec.ptr;
    if ((bVar1 != 0x2d) && (func = (char *)(ulong)bVar1, in_RCX = vec.ptr, bVar1 != 0x2b)) break;
    in_RCX = vec.ptr + 1;
    vec.len = vec.len - 1;
    vec.ptr = in_RCX;
    iVar2 = parse_match_net(&vec,sa,1);
    func = extraout_RDX_00;
    if (iVar2 < 0) break;
    if (iVar2 != 0) {
      iVar3 = (int)(char)bVar1;
    }
  }
  mg_cry_internal_wrap
            ((mg_connection *)0x0,phys_ctx,func,(uint)in_RCX,"%s: subnet must be [+|-]IP-addr[/x]",
             "check_acl");
  return -1;
}

Assistant:

static int
check_acl(struct mg_context *phys_ctx, const union usa *sa)
{
	int allowed, flag, matched;
	struct vec vec;

	if (phys_ctx) {
		const char *list = phys_ctx->dd.config[ACCESS_CONTROL_LIST];

		/* If any ACL is set, deny by default */
		allowed = (list == NULL) ? '+' : '-';

		while ((list = next_option(list, &vec, NULL)) != NULL) {
			flag = vec.ptr[0];
			matched = -1;
			if ((vec.len > 0) && ((flag == '+') || (flag == '-'))) {
				vec.ptr++;
				vec.len--;
				matched = parse_match_net(&vec, sa, 1);
			}
			if (matched < 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: subnet must be [+|-]IP-addr[/x]",
				                    __func__);
				return -1;
			}
			if (matched) {
				allowed = flag;
			}
		}

		return allowed == '+';
	}
	return -1;
}